

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

optional<unsigned_int> convert_gram(IndexType type,int index,QString *string)

{
  pointer pQVar1;
  size_t sVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  optional<unsigned_int> oVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  sVar2 = get_ngram_size_for(type);
  if ((ulong)(((long)(string->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(string->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <
      (ulong)(long)((int)sVar2 + index)) {
LAB_00185859:
    uVar6 = 0;
    uVar5 = 0;
    uVar7 = 0;
  }
  else {
    lVar8 = (long)index * 0x18;
    uVar7 = 0;
    do {
      pQVar1 = (string->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pQVar1->opts_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   + lVar8 + 8) -
          *(long *)((long)&(pQVar1->opts_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   + lVar8) != 1) goto LAB_00185859;
      pvVar3 = QToken::possible_values
                         ((QToken *)
                          ((long)&(pQVar1->opts_).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl + lVar8));
      uVar7 = (ulong)*(pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start | uVar7 << 8;
      lVar8 = lVar8 + 0x18;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
    oVar4 = convert_gram(type,uVar7);
    uVar6 = (ulong)oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int> & 0xffffff0000000000;
    uVar5 = (ulong)oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int> & 0xff00000000;
    uVar7 = (ulong)oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int> & 0xffffffff;
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)(uVar6 | uVar5 | uVar7);
}

Assistant:

std::optional<TriGram> convert_gram(IndexType type, int index,
                                    const QString &string) {
    int size = get_ngram_size_for(type);
    if (index + size > string.size()) {
        return std::nullopt;
    }
    uint64_t source = 0;
    for (int i = 0; i < size; i++) {
        if (!string[index + i].unique()) {
            return std::nullopt;
        }
        source = (source << 8) | string[index + i].possible_values()[0];
    }
    return convert_gram(type, source);
}